

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

edge_id * __thiscall merlin::graph::add_edge(graph *this,index i,index j)

{
  bool bVar1;
  edge_id *this_00;
  size_t sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  edge_id local_80;
  edge_id local_60;
  size_type local_40;
  size_t emax;
  size_t eji;
  size_t eij;
  index j_local;
  index i_local;
  graph *this_local;
  
  eij = j;
  j_local = i;
  i_local = (index)this;
  this_00 = edge(this,i,j);
  bVar1 = edge_id::operator!=(this_00,(edge_id *)&edge_id::NO_EDGE);
  if (bVar1) {
    this_local = (graph *)edge(this,j_local,eij);
  }
  else {
    sVar2 = num_edges(this);
    local_40 = sVar2 << 1;
    bVar1 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
            empty(&this->m_evacant);
    if (bVar1) {
      sVar6 = local_40 + 1;
      eji = local_40;
      local_40 = sVar6;
      std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::resize(&this->m_edges,sVar6);
    }
    else {
      pvVar3 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::top(&this->m_evacant);
      eji = *pvVar3;
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                (&this->m_evacant);
    }
    bVar1 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
            empty(&this->m_evacant);
    if (bVar1) {
      sVar6 = local_40 + 1;
      emax = local_40;
      local_40 = sVar6;
      std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::resize(&this->m_edges,sVar6);
    }
    else {
      pvVar3 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::top(&this->m_evacant);
      emax = *pvVar3;
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                (&this->m_evacant);
    }
    edge_id::edge_id(&local_60,j_local,eij,eji,emax);
    pvVar4 = std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::operator[]
                       (&this->m_edges,eji);
    pvVar4->first = local_60.first;
    pvVar4->second = local_60.second;
    pvVar4->idx = local_60.idx;
    pvVar4->ridx = local_60.ridx;
    pvVar4 = std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::operator[]
                       (&this->m_edges,eji);
    pvVar5 = std::
             vector<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ::operator[](&this->m_adj,j_local);
    my_set<merlin::edge_id>::operator|=(pvVar5,pvVar4);
    edge_id::edge_id(&local_80,eij,j_local,emax,eji);
    pvVar4 = std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::operator[]
                       (&this->m_edges,emax);
    pvVar4->first = local_80.first;
    pvVar4->second = local_80.second;
    pvVar4->idx = local_80.idx;
    pvVar4->ridx = local_80.ridx;
    pvVar4 = std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::operator[]
                       (&this->m_edges,emax);
    pvVar5 = std::
             vector<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ::operator[](&this->m_adj,eij);
    my_set<merlin::edge_id>::operator|=(pvVar5,pvVar4);
    this_local = (graph *)std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::operator[]
                                    (&this->m_edges,eji);
  }
  return (edge_id *)this_local;
}

Assistant:

const edge_id& add_edge(index i, index j) { // add edges (i,j) and (j,i) to adj
		// std::cout<<"Add edge "<<i<<","<<j<<"\n";
		if (edge(i,j) != edge_id::NO_EDGE)
			return edge(i,j);	// if exists already do nothing

		size_t eij, eji, emax=2*num_edges();	// otherwise get two edge indices
		if (m_evacant.empty()) {
			eij=emax++;
			m_edges.resize(emax);
		} else {
			eij=m_evacant.top();
			m_evacant.pop();
		}
		if (m_evacant.empty()) {
			eji=emax++;
			m_edges.resize(emax);
		} else {
			eji=m_evacant.top();
			m_evacant.pop();
		}

		m_edges[eij] = edge_id(i,j,eij,eji);
		m_adj[i] |= m_edges[eij];
		m_edges[eji] = edge_id(j,i,eji,eij);
		m_adj[j] |= m_edges[eji];

		return m_edges[eij];
	}